

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O2

int string_is_numeric(char *value)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = strlen(value);
  if (sVar3 != 0) {
    if (sVar3 == 1) {
      if (9 < (byte)(*value - 0x30U)) {
        return -0x14;
      }
    }
    else {
      cVar2 = *value;
      if (((9 < (byte)(cVar2 - 0x30U)) && (cVar2 != '-')) && (cVar2 != '+')) {
        return -0x14;
      }
    }
    uVar4 = 1;
    do {
      if (sVar3 <= uVar4) {
        return 0;
      }
      pcVar1 = value + uVar4;
      uVar4 = uVar4 + 1;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
  }
  return -0x14;
}

Assistant:

static int string_is_numeric (const char* value)
{
       size_t len = strlen(value);
       size_t i;

       if (len == 0) {
               return (ARCHIVE_WARN);
       }
       else if (len == 1 && !(value[0] >= '0' && value[0] <= '9')) {
               return (ARCHIVE_WARN);
       }
       else if (!(value[0] >= '0' && value[0] <= '9') &&
                value[0] != '-' && value[0] != '+') {
               return (ARCHIVE_WARN);
       }

       for (i = 1; i < len; i++) {
               if (!(value[i] >= '0' && value[i] <= '9')) {
                       return (ARCHIVE_WARN);
               }
       }

       return (ARCHIVE_OK);
}